

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_writer_begin_map(labpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  uint32_t count_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x17a,"void labpack_writer_begin_map(labpack_writer_t *, uint32_t)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    mpack_start_map(writer->encoder,count);
    labpack_writer_check_encoder(writer);
  }
  return;
}

Assistant:

void
labpack_writer_begin_map(labpack_writer_t* writer, uint32_t count)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_start_map(writer->encoder, count);
        labpack_writer_check_encoder(writer);
    }
}